

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O1

size_t booster::locale::util::formatting_size_traits<char>::size(string *s,locale *l)

{
  size_t sVar1;
  byte bVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  info *piVar6;
  size_t sVar7;
  size_t sVar8;
  
  bVar4 = std::has_facet<booster::locale::info>(l);
  if (bVar4) {
    piVar6 = std::use_facet<booster::locale::info>(l);
    iVar5 = (**(code **)(*(long *)piVar6 + 0x18))(piVar6);
    sVar3 = s->_M_string_length;
    sVar7 = sVar3;
    if (iVar5 != 0) {
      if (sVar3 == 0) {
        sVar7 = 0;
      }
      else {
        sVar8 = 0;
        sVar7 = 0;
        do {
          bVar2 = (s->_M_dataplus)._M_p[sVar8];
          sVar1 = sVar7 + 1;
          if (0xbf < bVar2) {
            sVar7 = sVar1;
          }
          if (-1 < (char)bVar2) {
            sVar7 = sVar1;
          }
          sVar8 = sVar8 + 1;
        } while (sVar3 != sVar8);
      }
    }
  }
  else {
    sVar7 = s->_M_string_length;
  }
  return sVar7;
}

Assistant:

static size_t size(std::string const &s,std::locale const &l)
    {
        if(!std::has_facet<info>(l))
            return s.size();
        if(!std::use_facet<info>(l).utf8())
            return s.size();
        // count code points, poor man's text size
        size_t res = 0;
        for(size_t i=0;i<s.size();i++) {
            unsigned char c = s[i];
            if(c <= 127)
                res ++;
            else if ((c & 0xC0) == 0xC0) { // first UTF-8 byte
                res ++;
            }
        }
        return res;
    }